

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_create(secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *seckey32)

{
  long in_RDX;
  uchar *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  secp256k1_ecmult_gen_context *unaff_retaddr;
  int ret;
  secp256k1_ge pk;
  secp256k1_scalar sk;
  secp256k1_scalar *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  undefined4 uVar1;
  secp256k1_scalar local_40;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  uVar1 = 0;
  if (in_RDI == (secp256k1_ecmult_gen_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,200,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff50,
               (char *)in_stack_ffffffffffffff48);
    iVar2 = 0;
  }
  else {
    local_20 = in_RDX;
    memset(in_RSI,0,0x60);
    iVar2 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar2 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar1,in_stack_ffffffffffffff50),
                 (char *)in_stack_ffffffffffffff48);
      iVar2 = 0;
    }
    else if (local_20 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar1,in_stack_ffffffffffffff50),
                 (char *)in_stack_ffffffffffffff48);
      iVar2 = 0;
    }
    else {
      iVar2 = secp256k1_ec_pubkey_create_helper
                        (unaff_retaddr,
                         (secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (secp256k1_ge *)in_RDI,in_RSI);
      secp256k1_keypair_save
                ((secp256k1_keypair *)CONCAT44(iVar2,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,(secp256k1_ge *)0x108074);
      secp256k1_memczero(in_RSI,0x60,(uint)((iVar2 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear(&local_40);
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_keypair_create(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *seckey32) {
    secp256k1_scalar sk;
    secp256k1_ge pk;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    memset(keypair, 0, sizeof(*keypair));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &sk, &pk, seckey32);
    secp256k1_keypair_save(keypair, &sk, &pk);
    secp256k1_memczero(keypair, sizeof(*keypair), !ret);

    secp256k1_scalar_clear(&sk);
    return ret;
}